

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

ByteData * __thiscall
cfd::ConfidentialTransactionController::CreateSignatureHash
          (ByteData *__return_storage_ptr__,ConfidentialTransactionController *this,Txid *txid,
          uint32_t vout,Script *redeem_script,SigHashType *sighash_type,ConfidentialValue *value,
          WitnessVersion version)

{
  uint32_t txin_index;
  ByteData256 sighash;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  SigHashType local_34;
  
  txin_index = core::ConfidentialTransaction::GetTxInIndex(&this->transaction_,txid,vout);
  core::Script::GetData((ByteData *)&local_68,redeem_script);
  core::SigHashType::SigHashType(&local_34,sighash_type);
  core::ConfidentialTransaction::GetElementsSignatureHash
            ((ByteData256 *)&local_50,&this->transaction_,txin_index,(ByteData *)&local_68,&local_34
             ,value,version);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
  core::ByteData256::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,
             (ByteData256 *)&local_50);
  core::ByteData::ByteData
            (__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
  return __return_storage_ptr__;
}

Assistant:

ByteData ConfidentialTransactionController::CreateSignatureHash(
    const Txid& txid, uint32_t vout, const Script& redeem_script,
    SigHashType sighash_type, const ConfidentialValue& value,
    WitnessVersion version) const {
  uint32_t txin_index = transaction_.GetTxInIndex(txid, vout);
  ByteData256 sighash = transaction_.GetElementsSignatureHash(
      txin_index, redeem_script.GetData(), sighash_type, value, version);
  return ByteData(sighash.GetBytes());
}